

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O3

pair<const_llvm::ConstantInt_*,_dg::vr::Relations>
dg::vr::RelationsAnalyzer::getBoundOnPointedToValue
          (vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
           *changeLocations,VectorSet<const_llvm::Value_*> *froms,Relation rel)

{
  pointer ppVVar1;
  VRLocation *pVVar2;
  pointer prVar3;
  bool bVar4;
  Type rel_00;
  uint uVar5;
  HandlePtr mVal;
  HandlePtr pBVar6;
  C rt;
  ulong *puVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  _Base_bitset<1UL> _Var8;
  pointer ppVVar9;
  C lt;
  pair<const_llvm::ConstantInt_*,_dg::vr::Relations> pVar10;
  undefined8 uVar11;
  
  ppVVar9 = (changeLocations->
            super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppVVar1 = (changeLocations->
            super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVVar9 == ppVVar1) {
    _Var8._M_w = 0xfff;
LAB_0011f58e:
    lt = (C)0x0;
  }
  else {
    _Var8._M_w = 0xfff;
    lt = (C)0x0;
    do {
      pVVar2 = *ppVVar9;
      pBVar6 = getCorrespondingByContent(&pVVar2->relations,froms);
      prVar3 = (pBVar6->relatedBuckets)._M_elems[10].vec.
               super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (prVar3 == (pBVar6->relatedBuckets)._M_elems[10].vec.
                    super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0011f58e;
      pVar10 = ValueRelations::getBound<dg::vr::Bucket>(&pVVar2->relations,prVar3->_M_data,rel);
      rt = pVar10.first;
      if (rt == (C)0x0) goto LAB_0011f58e;
      if (lt == (C)0x0) {
LAB_0011f542:
        uVar11 = 0;
        uVar5 = dg::vr::Relations::getStrict(rel);
        if (0xb < uVar5) {
          std::__throw_out_of_range_fmt
                    ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",
                     (ulong)uVar5,0xc,in_R8,in_R9,uVar11);
        }
        puVar7 = (ulong *)dg::vr::Relations::addImplied();
        _Var8._M_w = *puVar7;
        lt = rt;
      }
      else {
        rel_00 = dg::vr::Relations::getStrict(rel);
        bVar4 = ValueRelations::compare(lt,rel_00,rt);
        if (bVar4) goto LAB_0011f542;
      }
      _Var8._M_w = _Var8._M_w & (ulong)pVar10.second.bits.super__Base_bitset<1UL>._M_w.bits;
      ppVVar9 = ppVVar9 + 1;
    } while (ppVVar9 != ppVVar1);
  }
  pVar10.second.bits.super__Base_bitset<1UL>._M_w = (bitset<12UL>)(bitset<12UL>)_Var8._M_w;
  pVar10.first = lt;
  return pVar10;
}

Assistant:

std::pair<RelationsAnalyzer::C, Relations>
RelationsAnalyzer::getBoundOnPointedToValue(
        const std::vector<const VRLocation *> &changeLocations,
        const VectorSet<V> &froms, Relation rel) {
    C bound = nullptr;
    Relations current = allRelations;

    for (const VRLocation *loc : changeLocations) {
        const ValueRelations &graph = loc->relations;
        HandlePtr from = getCorrespondingByContent(graph, froms);
        assert(from);
        if (!graph.hasLoad(*from))
            return {nullptr, current};

        Handle pointedTo = graph.getPointedTo(*from);
        auto valueRels = graph.getBound(pointedTo, rel);

        if (!valueRels.first)
            return {nullptr, current};

        if (!bound || ValueRelations::compare(bound, Relations::getStrict(rel),
                                              valueRels.first)) {
            bound = valueRels.first;
            current = Relations().set(Relations::getStrict(rel)).addImplied();
        }

        current &= valueRels.second;
        assert(current.any());
    }
    return {bound, current};
}